

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_replacement_pass.cpp
# Opt level: O3

void __thiscall
spvtools::opt::ScalarReplacementPass::CopyPointerDecorationsToVariable
          (ScalarReplacementPass *this,Instruction *from,Instruction *to)

{
  IRContext *pIVar1;
  DecorationManager *this_00;
  pointer pOVar2;
  uint32_t uVar3;
  array<signed_char,_4UL> aVar4;
  Analysis AVar5;
  Instruction *pIVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  pointer ppIVar10;
  undefined1 local_70 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_50;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_48;
  
  pIVar1 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar1->valid_analyses_ & kAnalysisDecorations) == kAnalysisNone) {
    IRContext::BuildDecorationManager(pIVar1);
  }
  this_00 = (pIVar1->decoration_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>._M_head_impl
  ;
  uVar3 = 0;
  if (from->has_result_id_ == true) {
    uVar3 = Instruction::GetSingleWordOperand(from,(uint)from->has_type_id_);
  }
  analysis::DecorationManager::GetDecorationsFor(&local_48,this_00,uVar3,false);
  ppIVar10 = local_48.
             super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (ppIVar10 ==
        local_48.
        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (local_48.
          super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.
                        super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
    pIVar6 = *ppIVar10;
    uVar9 = (pIVar6->has_result_id_ & 1) + 1;
    if (pIVar6->has_type_id_ == false) {
      uVar9 = (uint)pIVar6->has_result_id_;
    }
    uVar3 = Instruction::GetSingleWordOperand(pIVar6,uVar9 + 1);
    if (uVar3 - 0x14eb < 2) {
      pIVar6 = Instruction::Clone(pIVar6,(this->super_MemPass).super_Pass.context_);
      aVar4._M_elems[0] = '\0';
      aVar4._M_elems[1] = '\0';
      aVar4._M_elems[2] = '\0';
      aVar4._M_elems[3] = '\0';
      if (to->has_result_id_ == true) {
        aVar4._M_elems = (_Type)Instruction::GetSingleWordOperand(to,(uint)to->has_type_id_);
      }
      local_70._0_8_ = &PTR__SmallVector_003d7c78;
      local_70._24_8_ = local_70 + 0x10;
      local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_70._8_8_ = 1;
      uVar7 = (ulong)(pIVar6->has_result_id_ & 1) + 1;
      if (pIVar6->has_type_id_ == false) {
        uVar7 = (ulong)pIVar6->has_result_id_;
      }
      pOVar2 = (pIVar6->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(pIVar6->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
              -0x5555555555555555;
      local_70._16_4_ = aVar4._M_elems;
      if (uVar8 < uVar7 || uVar8 - uVar7 == 0) {
        __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                      ,0x2b8,
                      "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                     );
      }
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)
                 ((long)((pOVar2->words).buffer + 0xfffffffffffffffc) +
                 (ulong)(uint)((int)uVar7 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_70);
      local_70._0_8_ = &PTR__SmallVector_003d7c78;
      if (local_50._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_50,local_50._M_head_impl);
      }
      pIVar1 = (this->super_MemPass).super_Pass.context_;
      AVar5 = pIVar1->valid_analyses_;
      if ((AVar5 & kAnalysisDecorations) != kAnalysisNone) {
        analysis::DecorationManager::AddDecoration
                  ((pIVar1->decoration_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
                   _M_head_impl,pIVar6);
        AVar5 = pIVar1->valid_analyses_;
      }
      if ((AVar5 & kAnalysisBegin) != kAnalysisNone) {
        analysis::DefUseManager::AnalyzeInstDefUse
                  ((pIVar1->def_use_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                   _M_head_impl,pIVar6);
      }
      utils::IntrusiveList<spvtools::opt::Instruction>::push_back
                (&(((pIVar1->module_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                    .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->
                  annotations_).super_IntrusiveList<spvtools::opt::Instruction>,pIVar6);
    }
    ppIVar10 = ppIVar10 + 1;
  } while( true );
}

Assistant:

void ScalarReplacementPass::CopyPointerDecorationsToVariable(Instruction* from,
                                                             Instruction* to) {
  // The RestrictPointer and AliasedPointer decorations are copied to all
  // members even if the new variable does not contain a pointer. It does
  // not hurt to do so.
  for (auto dec_inst :
       get_decoration_mgr()->GetDecorationsFor(from->result_id(), false)) {
    uint32_t decoration;
    decoration = dec_inst->GetSingleWordInOperand(1u);
    switch (spv::Decoration(decoration)) {
      case spv::Decoration::AliasedPointer:
      case spv::Decoration::RestrictPointer: {
        std::unique_ptr<Instruction> new_dec_inst(dec_inst->Clone(context()));
        new_dec_inst->SetInOperand(0, {to->result_id()});
        context()->AddAnnotationInst(std::move(new_dec_inst));
      } break;
      default:
        break;
    }
  }
}